

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O2

void __thiscall gvr::PointCloud::loadPLY(PointCloud *this,PLYReader *ply)

{
  bool bVar1;
  ply_type pVar2;
  ply_type pVar3;
  ply_type pVar4;
  long lVar5;
  ulong uVar6;
  allocator local_2a6;
  allocator local_2a5;
  undefined4 local_2a4;
  allocator local_2a0;
  allocator local_29f;
  allocator local_29e;
  allocator local_29d;
  allocator local_29c;
  allocator local_29b;
  allocator local_29a;
  allocator local_299;
  FloatArrayReceiver sx;
  FloatArrayReceiver ss;
  string local_258;
  FloatArrayReceiver sy;
  FloatArrayReceiver se;
  string local_1f8;
  FloatArrayReceiver vx;
  FloatArrayReceiver vy;
  FloatArrayReceiver sc;
  FloatArrayReceiver vz;
  FloatArrayReceiver sz;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&vy);
  lVar5 = PLYReader::instancesOfElement(ply,(string *)&vx);
  std::__cxx11::string::~string((string *)&vx);
  Model::setOriginFromPLY(&this->super_Model,ply);
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&se);
  std::__cxx11::string::string((string *)&vy,"scan_size",(allocator *)&sc);
  pVar2 = PLYReader::getTypeOfProperty(ply,(string *)&vx,(string *)&vy);
  uVar6 = 1;
  if (pVar2 == ply_none) {
    std::__cxx11::string::string((string *)&local_50,"vertex",&local_299);
    std::__cxx11::string::string((string *)&local_70,"scan_error",&local_29a);
    pVar3 = PLYReader::getTypeOfProperty(ply,&local_50,&local_70);
    if (pVar3 != ply_none) goto LAB_00129540;
    std::__cxx11::string::string((string *)&local_90,"vertex",&local_29b);
    std::__cxx11::string::string((string *)&local_b0,"scan_conf",&local_29c);
    pVar3 = PLYReader::getTypeOfProperty(ply,&local_90,&local_b0);
    uVar6 = (ulong)(pVar3 != ply_none);
    local_2a4 = (undefined4)CONCAT71((uint7)(uint3)(pVar3 >> 8),1);
  }
  else {
LAB_00129540:
    local_2a4 = 0;
  }
  std::__cxx11::string::string((string *)&vz,"vertex",(allocator *)&sx);
  std::__cxx11::string::string((string *)&ss,"sx",(allocator *)&sy);
  pVar3 = PLYReader::getTypeOfProperty(ply,(string *)&vz,(string *)&ss);
  if (pVar3 != ply_none) {
    std::__cxx11::string::string((string *)&local_d0,"vertex",&local_29d);
    std::__cxx11::string::string((string *)&local_f0,"sy",&local_29e);
    pVar4 = PLYReader::getTypeOfProperty(ply,&local_d0,&local_f0);
    if (pVar4 != ply_none) {
      std::__cxx11::string::string((string *)&local_110,"vertex",&local_29f);
      std::__cxx11::string::string((string *)&local_130,"sz",&local_2a0);
      PLYReader::getTypeOfProperty(ply,&local_110,&local_130);
      bVar1 = true;
      goto LAB_0012963d;
    }
  }
  bVar1 = false;
LAB_0012963d:
  (*(this->super_Model)._vptr_Model[9])(this,lVar5,uVar6);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
  }
  if (pVar3 != ply_none) {
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&vz);
  if ((char)local_2a4 != '\0') {
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (pVar2 == ply_none) {
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&vy);
  std::__cxx11::string::~string((string *)&vx);
  FloatArrayReceiver::FloatArrayReceiver(&vx,this->vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&vy,this->vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&vz,this->vertex,3,2);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"x",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vx.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"y",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vy.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"z",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vz.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  FloatArrayReceiver::FloatArrayReceiver(&ss,this->scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&se,this->scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sc,this->scanprop,3,2);
  if (this->scanprop != (float *)0x0) {
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_size",(allocator *)&local_258);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&ss.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_error",(allocator *)&local_258);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&se.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_conf",(allocator *)&local_258);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&sc.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
  }
  FloatArrayReceiver::FloatArrayReceiver(&sx,this->scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&sy,this->scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sz,this->scanpos,3,2);
  if (this->scanpos != (float *)0x0) {
    std::__cxx11::string::string((string *)&local_258,"vertex",&local_2a5);
    std::__cxx11::string::string((string *)&local_1f8,"sx",&local_2a6);
    PLYReader::setReceiver(ply,&local_258,&local_1f8,&sx.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::string((string *)&local_258,"vertex",&local_2a5);
    std::__cxx11::string::string((string *)&local_1f8,"sy",&local_2a6);
    PLYReader::setReceiver(ply,&local_258,&local_1f8,&sy.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::string((string *)&local_258,"vertex",&local_2a5);
    std::__cxx11::string::string((string *)&local_1f8,"sz",&local_2a6);
    PLYReader::setReceiver(ply,&local_258,&local_1f8,&sz.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_258);
  }
  PLYReader::readData(ply);
  return;
}

Assistant:

void PointCloud::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for point cloud

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  // read data

  ply.readData();
}